

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceDecomposition::ForceDecomposition
          (ForceDecomposition *this,SimInfo *info,InteractionManager *iMan)

{
  bool bVar1;
  int iVar2;
  SnapshotManager *pSVar3;
  ForceField *pFVar4;
  undefined8 in_RDX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  RealType RVar5;
  Globals *simParams_;
  value_type *in_stack_fffffffffffffe08;
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *in_stack_fffffffffffffe10;
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *this_00;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 *puVar6;
  Vector3<int> *in_stack_fffffffffffffe20;
  Vector3<int> *this_01;
  
  *in_RDI = &PTR__ForceDecomposition_004819d8;
  in_RDI[1] = in_RSI;
  in_RDI[5] = in_RDX;
  *(undefined1 *)((long)in_RDI + 0x3c) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17b926);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x17b93f);
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x12));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x19));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x20));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x27));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x2e));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 0x35));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17b9df);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17b9fb);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17ba17);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17ba33);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x17ba4f);
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::vector
            ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)0x17ba6b);
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::vector
            ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)0x17ba87);
  Vector3<int>::Vector3((Vector3<int> *)0x17ba9b);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)0x17bab9);
  pSVar3 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[1]);
  in_RDI[2] = pSVar3;
  iVar2 = SnapshotManager::getAtomStorageLayout((SnapshotManager *)in_RDI[2]);
  *(int *)(in_RDI + 6) = iVar2;
  iVar2 = SnapshotManager::getRigidBodyStorageLayout((SnapshotManager *)in_RDI[2]);
  *(int *)((long)in_RDI + 0x34) = iVar2;
  iVar2 = SnapshotManager::getCutoffGroupStorageLayout((SnapshotManager *)in_RDI[2]);
  *(int *)(in_RDI + 7) = iVar2;
  pFVar4 = SimInfo::getForceField((SimInfo *)in_RDI[1]);
  in_RDI[4] = pFVar4;
  SimInfo::getSimParams(in_RSI);
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x17bb9f);
  *(bool *)((long)in_RDI + 0x3d) = bVar1;
  SimInfo::getSimParams((SimInfo *)in_RDI[1]);
  bVar1 = Globals::havePrintHeatFlux((Globals *)0x17bbed);
  if ((bVar1) && (bVar1 = Globals::getPrintHeatFlux((Globals *)0x17bc13), bVar1)) {
    *(undefined1 *)((long)in_RDI + 0x3c) = 1;
  }
  bVar1 = Globals::haveSkinThickness((Globals *)0x17bc9e);
  if (bVar1) {
    RVar5 = Globals::getSkinThickness((Globals *)0x17bcc1);
    in_RDI[8] = RVar5;
  }
  else {
    in_RDI[8] = 0x3ff0000000000000;
    snprintf(painCave.errMsg,2000,
             "ForceDecomposition: No value was set for the skinThickness.\n\tOpenMD will use a default value of %f Angstroms\n\tfor this simulation\n"
             ,in_RDI[8]);
    painCave.severity = 3;
    painCave.isFatal = 0;
    simError();
  }
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::clear
            ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)0x17bd59);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  Vector3<int>::Vector3
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,(int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  this_01 = (Vector3<int> *)(in_RDI + 0x4e);
  Vector3<int>::Vector3
            (this_01,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  puVar6 = in_RDI + 0x4e;
  Vector3<int>::Vector3
            (this_01,(int)((ulong)puVar6 >> 0x20),(int)puVar6,
             (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  this_00 = (vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)(in_RDI + 0x4e);
  Vector3<int>::Vector3
            (this_01,(int)((ulong)puVar6 >> 0x20),(int)puVar6,(int)((ulong)this_00 >> 0x20));
  std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::push_back
            (this_00,in_stack_fffffffffffffe08);
  return;
}

Assistant:

ForceDecomposition::ForceDecomposition(SimInfo* info,
                                         InteractionManager* iMan) :
      info_(info),
      interactionMan_(iMan), needVelocities_(false) {
    sman_                     = info_->getSnapshotManager();
    atomStorageLayout_        = sman_->getAtomStorageLayout();
    rigidBodyStorageLayout_   = sman_->getRigidBodyStorageLayout();
    cutoffGroupStorageLayout_ = sman_->getCutoffGroupStorageLayout();
    ff_                       = info_->getForceField();

    usePeriodicBoundaryConditions_ =
        info->getSimParams()->getUsePeriodicBoundaryConditions();

    Globals* simParams_ = info_->getSimParams();
    if (simParams_->havePrintHeatFlux()) {
      if (simParams_->getPrintHeatFlux()) { needVelocities_ = true; }
    }

    if (simParams_->haveSkinThickness()) {
      skinThickness_ = simParams_->getSkinThickness();
    } else {
      skinThickness_ = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ForceDecomposition: No value was set for the skinThickness.\n"
               "\tOpenMD will use a default value of %f Angstroms\n"
               "\tfor this simulation\n",
               skinThickness_);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    // cellOffsets are the partial space for the cell lists used in
    // constructing the neighbor lists
    cellOffsets_.clear();
    cellOffsets_.push_back(Vector3i(0, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 1, 0));
    cellOffsets_.push_back(Vector3i(-1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 1, 1));
    cellOffsets_.push_back(Vector3i(0, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 0, 1));
    cellOffsets_.push_back(Vector3i(-1, -1, 1));
    cellOffsets_.push_back(Vector3i(0, -1, 1));
    cellOffsets_.push_back(Vector3i(1, -1, 1));
  }